

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

shared_ptr<mcc::While> __thiscall mcc::Parser::WhileStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TokenType in_ESI;
  shared_ptr<mcc::While> sVar1;
  undefined1 local_c8 [8];
  shared_ptr<mcc::Stmt> loop_block;
  string local_b0 [32];
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  shared_ptr<mcc::Expr> condition;
  allocator<char> local_59;
  string local_58 [32];
  shared_ptr<mcc::Token> local_38;
  undefined1 local_28 [8];
  shared_ptr<mcc::Token> while_token;
  Parser *this_local;
  
  Consume((Parser *)local_28,in_ESI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"Expected \'(\' after \'while\'",&local_59);
  Consume((Parser *)&local_38,in_ESI,(string *)0x1);
  std::shared_ptr<mcc::Token>::~shared_ptr(&local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  Expression((Parser *)local_80,in_ESI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"Expected \')\' after \'while\' condition",
             (allocator<char> *)
             ((long)&loop_block.super___shared_ptr<mcc::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  Consume((Parser *)local_90,in_ESI,(string *)0x2);
  std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&loop_block.super___shared_ptr<mcc::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  Statement((Parser *)local_c8);
  DisallowDecl((shared_ptr<mcc::Stmt> *)local_c8,(shared_ptr<mcc::Token> *)local_28);
  std::
  make_shared<mcc::While,std::shared_ptr<mcc::Token>&,std::shared_ptr<mcc::Expr>&,std::shared_ptr<mcc::Stmt>&,bool>
            ((shared_ptr<mcc::Token> *)this,(shared_ptr<mcc::Expr> *)local_28,
             (shared_ptr<mcc::Stmt> *)local_80,(bool *)local_c8);
  std::shared_ptr<mcc::Stmt>::~shared_ptr((shared_ptr<mcc::Stmt> *)local_c8);
  std::shared_ptr<mcc::Expr>::~shared_ptr((shared_ptr<mcc::Expr> *)local_80);
  std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_28);
  sVar1.super___shared_ptr<mcc::While,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mcc::While,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mcc::While>)sVar1.super___shared_ptr<mcc::While,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<While> Parser::WhileStatement() {
  std::shared_ptr<Token> while_token = Consume(TokenType::T_WHILE);
  Consume(TokenType::T_LPAREN, "Expected '(' after 'while'");
  std::shared_ptr<Expr> condition = Expression(0);
  Consume(TokenType::T_RPAREN, "Expected ')' after 'while' condition");
  std::shared_ptr<Stmt> loop_block = Statement();
  DisallowDecl(loop_block, while_token);
  return std::make_shared<While>(while_token, condition, loop_block, false);
}